

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O1

bool cmGetCMakePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  cmMakefile *pcVar1;
  int iVar2;
  cmState *this;
  cmValue cVar3;
  cmGlobalGenerator *pcVar4;
  ulong uVar5;
  string_view value;
  string output;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  local_70 = local_60;
  if (uVar5 < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NOTFOUND","");
    iVar2 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar2 == 0) {
      pcVar1 = status->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"VARIABLES","");
      cVar3 = cmMakefile::GetProperty(pcVar1,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (cVar3.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar2 == 0) {
        local_68 = 0;
        *(undefined1 *)local_70 = 0;
        pcVar1 = status->Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MACROS","");
        cVar3 = cmMakefile::GetProperty(pcVar1,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (cVar3.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&local_70);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar2 == 0) {
          pcVar4 = cmMakefile::GetGlobalGenerator(status->Makefile);
          cmList::
          to_string<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&local_50,&pcVar4->InstallComponents);
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
            cVar3.Value = (string *)0x0;
          }
          else {
            this = cmMakefile::GetState(status->Makefile);
            cVar3 = cmState::GetGlobalProperty
                              (this,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1);
          }
          if (cVar3.Value != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_70);
          }
        }
      }
    }
    value._M_str = (char *)local_70;
    value._M_len = local_68;
    cmMakefile::AddDefinition(status->Makefile,name,value);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return 0x20 < uVar5;
}

Assistant:

bool cmGetCMakePropertyCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::string const& variable = args[0];
  std::string output = "NOTFOUND";

  if (args[1] == "VARIABLES") {
    if (cmValue varsProp = status.GetMakefile().GetProperty("VARIABLES")) {
      output = *varsProp;
    }
  } else if (args[1] == "MACROS") {
    output.clear();
    if (cmValue macrosProp = status.GetMakefile().GetProperty("MACROS")) {
      output = *macrosProp;
    }
  } else if (args[1] == "COMPONENTS") {
    const std::set<std::string>* components =
      status.GetMakefile().GetGlobalGenerator()->GetInstallComponents();
    output = cmList::to_string(*components);
  } else {
    cmValue prop = nullptr;
    if (!args[1].empty()) {
      prop = status.GetMakefile().GetState()->GetGlobalProperty(args[1]);
    }
    if (prop) {
      output = *prop;
    }
  }

  status.GetMakefile().AddDefinition(variable, output);

  return true;
}